

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyBalance.c
# Opt level: O0

Ivy_Obj_t *
Ivy_NodeBalanceBuildSuper(Ivy_Man_t *p,Vec_Ptr_t *vSuper,Ivy_Type_t Type,int fUpdateLevel)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Obj_t *p1;
  int local_38;
  int LeftBound;
  Ivy_Obj_t *pObj2;
  Ivy_Obj_t *pObj1;
  int fUpdateLevel_local;
  Ivy_Type_t Type_local;
  Vec_Ptr_t *vSuper_local;
  Ivy_Man_t *p_local;
  
  if (1 < vSuper->nSize) {
    Vec_PtrSort(vSuper,Ivy_NodeCompareLevelsDecrease);
    while (1 < vSuper->nSize) {
      if (fUpdateLevel == 0) {
        local_38 = 0;
      }
      else {
        local_38 = Ivy_NodeBalanceFindLeft(vSuper);
      }
      Ivy_NodeBalancePermute(p,vSuper,local_38,(uint)(Type == IVY_EXOR));
      pIVar1 = (Ivy_Obj_t *)Vec_PtrPop(vSuper);
      p1 = (Ivy_Obj_t *)Vec_PtrPop(vSuper);
      pIVar1 = Ivy_Oper(p,pIVar1,p1,Type);
      Ivy_NodeBalancePushUniqueOrderByLevel(vSuper,pIVar1);
    }
    pIVar1 = (Ivy_Obj_t *)Vec_PtrEntry(vSuper,0);
    return pIVar1;
  }
  __assert_fail("vSuper->nSize > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyBalance.c"
                ,0xb3,
                "Ivy_Obj_t *Ivy_NodeBalanceBuildSuper(Ivy_Man_t *, Vec_Ptr_t *, Ivy_Type_t, int)");
}

Assistant:

Ivy_Obj_t * Ivy_NodeBalanceBuildSuper( Ivy_Man_t * p, Vec_Ptr_t * vSuper, Ivy_Type_t Type, int fUpdateLevel )
{
    Ivy_Obj_t * pObj1, * pObj2;
    int LeftBound;
    assert( vSuper->nSize > 1 );
    // sort the new nodes by level in the decreasing order
    Vec_PtrSort( vSuper, (int (*)(void))Ivy_NodeCompareLevelsDecrease );
    // balance the nodes
    while ( vSuper->nSize > 1 )
    {
        // find the left bound on the node to be paired
        LeftBound = (!fUpdateLevel)? 0 : Ivy_NodeBalanceFindLeft( vSuper );
        // find the node that can be shared (if no such node, randomize choice)
        Ivy_NodeBalancePermute( p, vSuper, LeftBound, Type == IVY_EXOR );
        // pull out the last two nodes
        pObj1 = (Ivy_Obj_t *)Vec_PtrPop(vSuper);
        pObj2 = (Ivy_Obj_t *)Vec_PtrPop(vSuper);
        Ivy_NodeBalancePushUniqueOrderByLevel( vSuper, Ivy_Oper(p, pObj1, pObj2, Type) );
    }
    return (Ivy_Obj_t *)Vec_PtrEntry(vSuper, 0);
}